

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O1

PrimInfo * __thiscall
embree::avx2::LineSegmentsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,mvector<PrimRef> *prims,
          size_t itime,range<unsigned_long> *r,size_t k,uint geomID)

{
  ulong uVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  PrimRef *pPVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  float fVar10;
  char *pcVar11;
  size_t sVar12;
  ulong uVar13;
  size_t *psVar14;
  size_t sVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  undefined1 auVar28 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar24 [64];
  undefined1 auVar26 [64];
  
  aVar23.m128[2] = INFINITY;
  aVar23._0_8_ = 0x7f8000007f800000;
  aVar23.m128[3] = INFINITY;
  auVar24 = ZEXT1664((undefined1  [16])aVar23);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar23;
  aVar25.m128[2] = -INFINITY;
  aVar25._0_8_ = 0xff800000ff800000;
  aVar25.m128[3] = -INFINITY;
  auVar26 = ZEXT1664((undefined1  [16])aVar25);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar25;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar23;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar25;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar17 = r->_begin;
  sVar15 = __return_storage_ptr__->end;
  aVar29 = aVar23;
  aVar27 = aVar25;
  if (uVar17 < r->_end) {
    uVar1 = itime + 1;
    auVar31._8_4_ = 0x7f800000;
    auVar31._0_8_ = 0x7f8000007f800000;
    auVar31._12_4_ = 0x7f800000;
    auVar32._8_4_ = 0xff800000;
    auVar32._0_8_ = 0xff800000ff800000;
    auVar32._12_4_ = 0xff800000;
    auVar33._8_4_ = 0xddccb9a2;
    auVar33._0_8_ = 0xddccb9a2ddccb9a2;
    auVar33._12_4_ = 0xddccb9a2;
    auVar34._8_4_ = 0x5dccb9a2;
    auVar34._0_8_ = 0x5dccb9a25dccb9a2;
    auVar34._12_4_ = 0x5dccb9a2;
    auVar30 = ZEXT1664((undefined1  [16])aVar23);
    auVar28 = ZEXT1664((undefined1  [16])aVar25);
    do {
      pBVar3 = (this->super_LineSegments).vertices.items;
      uVar2 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                       *(long *)&(this->super_LineSegments).field_0x68 * uVar17);
      uVar18 = (ulong)uVar2;
      uVar20 = (ulong)(uVar2 + 1);
      uVar13 = (pBVar3->super_RawBufferView).num;
      auVar35 = auVar32;
      auVar37 = auVar31;
      if (uVar20 < uVar13) {
        pcVar11 = pBVar3[itime].super_RawBufferView.ptr_ofs;
        sVar16 = pBVar3[itime].super_RawBufferView.stride;
        auVar36 = *(undefined1 (*) [16])(pcVar11 + sVar16 * uVar18);
        auVar5 = vcmpps_avx(auVar36,auVar33,2);
        auVar6 = vcmpps_avx(auVar36,auVar34,5);
        auVar5 = vorps_avx(auVar5,auVar6);
        if ((((auVar5 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar5 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar5 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar5[0xf])
        {
          psVar14 = &pBVar3[itime + 1].super_RawBufferView.stride;
          bVar22 = false;
          sVar12 = itime;
          do {
            auVar5 = *(undefined1 (*) [16])(pcVar11 + sVar16 * uVar20);
            auVar6 = vcmpps_avx(auVar5,auVar33,2);
            auVar7 = vcmpps_avx(auVar5,auVar34,5);
            auVar6 = vorps_avx(auVar6,auVar7);
            if ((((auVar6 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar6 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar6 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar6[0xf] < '\0') break;
            auVar36 = vshufps_avx(auVar36,auVar36,0xff);
            auVar5 = vshufps_avx(auVar5,auVar5,0xff);
            auVar36 = vminss_avx(auVar36,auVar5);
            if (auVar36._0_4_ < 0.0) break;
            sVar12 = sVar12 + 1;
            bVar22 = itime < sVar12;
            if (itime < sVar12) {
              if (uVar13 <= uVar20) goto LAB_01a4a2af;
              goto LAB_01a4a19c;
            }
            pcVar11 = ((RawBufferView *)(psVar14 + -2))->ptr_ofs;
            sVar16 = *psVar14;
            psVar14 = psVar14 + 7;
            auVar36 = *(undefined1 (*) [16])(pcVar11 + sVar16 * uVar18);
            auVar5 = vcmpps_avx(auVar36,auVar33,2);
            auVar6 = vcmpps_avx(auVar36,auVar34,5);
            auVar5 = vorps_avx(auVar5,auVar6);
          } while ((((auVar5 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                    (auVar5 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar5 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   -1 < auVar5[0xf]);
        }
        else {
          bVar22 = false;
        }
        if ((bool)(uVar20 < uVar13 & bVar22)) {
LAB_01a4a19c:
          pcVar11 = pBVar3[uVar1].super_RawBufferView.ptr_ofs;
          sVar16 = pBVar3[uVar1].super_RawBufferView.stride;
          auVar36 = *(undefined1 (*) [16])(pcVar11 + sVar16 * uVar18);
          auVar5 = vcmpps_avx(auVar36,auVar33,2);
          auVar6 = vcmpps_avx(auVar36,auVar34,5);
          auVar5 = vorps_avx(auVar5,auVar6);
          if ((((auVar5 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar5 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar5 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar5[0xf]
             ) {
            psVar14 = &pBVar3[itime + 2].super_RawBufferView.stride;
            bVar22 = false;
            uVar13 = uVar1;
            do {
              auVar5 = *(undefined1 (*) [16])(pcVar11 + sVar16 * uVar20);
              auVar6 = vcmpps_avx(auVar5,auVar33,2);
              auVar7 = vcmpps_avx(auVar5,auVar34,5);
              auVar6 = vorps_avx(auVar6,auVar7);
              if ((((auVar6 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar6 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar6 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar6[0xf] < '\0') break;
              auVar36 = vshufps_avx(auVar36,auVar36,0xff);
              auVar5 = vshufps_avx(auVar5,auVar5,0xff);
              auVar36 = vminss_avx(auVar36,auVar5);
              if (auVar36._0_4_ < 0.0) break;
              uVar13 = uVar13 + 1;
              bVar22 = uVar1 < uVar13;
              if (uVar1 < uVar13) goto LAB_01a4a259;
              pcVar11 = ((RawBufferView *)(psVar14 + -2))->ptr_ofs;
              sVar16 = *psVar14;
              psVar14 = psVar14 + 7;
              auVar36 = *(undefined1 (*) [16])(pcVar11 + sVar16 * uVar18);
              auVar5 = vcmpps_avx(auVar36,auVar33,2);
              auVar6 = vcmpps_avx(auVar36,auVar34,5);
              auVar5 = vorps_avx(auVar5,auVar6);
            } while ((((auVar5 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar5 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar5 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     -1 < auVar5[0xf]);
            if (bVar22) {
LAB_01a4a259:
              pcVar11 = pBVar3[itime].super_RawBufferView.ptr_ofs;
              sVar16 = pBVar3[itime].super_RawBufferView.stride;
              lVar19 = uVar18 * sVar16;
              lVar21 = uVar20 * sVar16;
              auVar35 = vminps_avx(*(undefined1 (*) [16])(pcVar11 + lVar19),
                                   *(undefined1 (*) [16])(pcVar11 + lVar21));
              auVar36 = vmaxps_avx(*(undefined1 (*) [16])(pcVar11 + lVar19),
                                   *(undefined1 (*) [16])(pcVar11 + lVar21));
              auVar37 = vmaxss_avx(ZEXT416(*(uint *)(pcVar11 + lVar21 + 0xc)),
                                   ZEXT416(*(uint *)(pcVar11 + lVar19 + 0xc)));
              fVar10 = auVar37._0_4_ * (this->super_LineSegments).maxRadiusScale;
              auVar37._4_4_ = fVar10;
              auVar37._0_4_ = fVar10;
              auVar37._8_4_ = fVar10;
              auVar37._12_4_ = fVar10;
              auVar37 = vsubps_avx(auVar35,auVar37);
              auVar35._0_4_ = auVar36._0_4_ + fVar10;
              auVar35._4_4_ = auVar36._4_4_ + fVar10;
              auVar35._8_4_ = auVar36._8_4_ + fVar10;
              auVar35._12_4_ = auVar36._12_4_ + fVar10;
              bVar22 = true;
              goto LAB_01a4a2c3;
            }
          }
        }
LAB_01a4a2af:
        bVar22 = false;
      }
      else {
        bVar22 = false;
      }
LAB_01a4a2c3:
      sVar16 = k;
      if (bVar22) {
        aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar37,ZEXT416(geomID),0x30);
        aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar35,ZEXT416((uint)uVar17),0x30);
        auVar37 = vminps_avx(auVar24._0_16_,(undefined1  [16])aVar8);
        auVar24 = ZEXT1664(auVar37);
        auVar37 = vmaxps_avx(auVar26._0_16_,(undefined1  [16])aVar9);
        auVar26 = ZEXT1664(auVar37);
        auVar36._0_4_ = aVar9.x + aVar8.x;
        auVar36._4_4_ = aVar9.y + aVar8.y;
        auVar36._8_4_ = aVar9.z + aVar8.z;
        auVar36._12_4_ = aVar9.field_3.w + aVar8.field_3.w;
        auVar37 = vminps_avx(auVar30._0_16_,auVar36);
        auVar30 = ZEXT1664(auVar37);
        auVar37 = vmaxps_avx(auVar28._0_16_,auVar36);
        auVar28 = ZEXT1664(auVar37);
        sVar15 = sVar15 + 1;
        sVar16 = k + 1;
        pPVar4 = prims->items;
        pPVar4[k].lower.field_0.field_1 = aVar8;
        pPVar4[k].upper.field_0.field_1 = aVar9;
      }
      aVar27 = auVar28._0_16_;
      aVar29 = auVar30._0_16_;
      aVar25 = auVar26._0_16_;
      aVar23 = auVar24._0_16_;
      uVar17 = uVar17 + 1;
      k = sVar16;
    } while (uVar17 < r->_end);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar23;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar25;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar29;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar27;
  __return_storage_ptr__->end = sVar15;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,itime,bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }